

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_compress.c
# Opt level: O0

int load_images(dircnt_t *dirptr,char *imgdirpath)

{
  int iVar1;
  DIR *__dirp;
  dirent *pdVar2;
  int local_34;
  int i;
  dirent *content;
  DIR *dir;
  char *imgdirpath_local;
  dircnt_t *dirptr_local;
  
  local_34 = 0;
  __dirp = opendir(imgdirpath);
  if (__dirp == (DIR *)0x0) {
    fprintf(_stderr,"Could not open Folder %s\n",imgdirpath);
    dirptr_local._4_4_ = 1;
  }
  else {
    fprintf(_stderr,"Folder opened successfully\n");
    while (pdVar2 = readdir(__dirp), pdVar2 != (dirent *)0x0) {
      iVar1 = strcmp(".",pdVar2->d_name);
      if ((iVar1 != 0) && (iVar1 = strcmp("..",pdVar2->d_name), iVar1 != 0)) {
        strcpy(dirptr->filename[local_34],pdVar2->d_name);
        local_34 = local_34 + 1;
      }
    }
    closedir(__dirp);
    dirptr_local._4_4_ = 0;
  }
  return dirptr_local._4_4_;
}

Assistant:

static int load_images(dircnt_t *dirptr, char *imgdirpath)
{
    DIR *dir;
    struct dirent* content;
    int i = 0;

    /*Reading the input images from given input directory*/

    dir = opendir(imgdirpath);
    if (!dir) {
        fprintf(stderr, "Could not open Folder %s\n", imgdirpath);
        return 1;
    } else   {
        fprintf(stderr, "Folder opened successfully\n");
    }

    while ((content = readdir(dir)) != NULL) {
        if (strcmp(".", content->d_name) == 0 || strcmp("..", content->d_name) == 0) {
            continue;
        }

        strcpy(dirptr->filename[i], content->d_name);
        i++;
    }
    closedir(dir);
    return 0;
}